

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Answer * __thiscall
capnp::_::anon_unknown_18::
ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::erase
          (Answer *__return_storage_ptr__,
          ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *this,
          uint id)

{
  undefined8 uVar1;
  Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext_&> MVar2;
  uint *puVar3;
  ArrayDisposer *pAVar4;
  byte local_6c;
  undefined1 local_68 [24];
  undefined1 auStack_50 [24];
  Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext_&> local_38;
  uint *puStack_30;
  ArrayDisposer *local_28;
  ArrayDisposer *local_20;
  
  if (id < 0x10) {
    RpcSystemBase::RpcConnectionState::Answer::Answer(__return_storage_ptr__,this->low + id);
    local_38.ptr = (RpcCallContext *)0x0;
    puStack_30 = (uint *)0x0;
    auStack_50._8_8_ = 0;
    auStack_50._16_8_ = (RpcCallContext *)0x0;
    local_68._16_8_ = (PipelineHook *)0x0;
    auStack_50._0_8_ = 0;
    local_68._0_8_ = (Disposer *)0x0;
    local_68._8_8_ = (Disposer *)0x0;
    local_28 = (ArrayDisposer *)0x0;
    RpcSystemBase::RpcConnectionState::Answer::operator=(this->low + id,(Answer *)local_68);
    puVar3 = puStack_30;
    MVar2.ptr = local_38.ptr;
    if (local_38.ptr != (RpcCallContext *)0x0) {
      local_38.ptr = (RpcCallContext *)0x0;
      puStack_30 = (uint *)0x0;
      (**local_28->_vptr_ArrayDisposer)(local_28,MVar2.ptr,4,puVar3,puVar3,0);
    }
    kj::
    OneOf<kj::Promise<void>,_capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,_kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_>
    ::destroy((OneOf<kj::Promise<void>,_capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,_kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_>
               *)(local_68 + 0x10));
    uVar1 = local_68._8_8_;
    if ((Disposer *)local_68._8_8_ != (Disposer *)0x0) {
      local_68._8_8_ = (Disposer *)0x0;
      (***(_func_int ***)local_68._0_8_)
                (local_68._0_8_,(*(_func_int ***)uVar1)[-2] + (long)(_func_int ***)uVar1);
    }
    local_6c = (byte)id;
    this->presenceBits =
         this->presenceBits & (-2 << (local_6c & 0x1f) | 0xfffffffeU >> 0x20 - (local_6c & 0x1f));
  }
  else {
    kj::
    Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>>
    ::find<0ul,unsigned_int&>
              ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>>
                *)local_68,(uint *)&this->high);
    if ((Entry *)local_68._0_8_ == (Entry *)0x0) {
      (__return_storage_ptr__->resultExports).ptr = (uint *)0x0;
      (__return_storage_ptr__->resultExports).size_ = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->task).field_1 + 8) = 0;
      (__return_storage_ptr__->callContext).ptr = (RpcCallContext *)0x0;
      *(undefined8 *)&__return_storage_ptr__->task = 0;
      *(undefined8 *)&(__return_storage_ptr__->task).field_1 = 0;
      (__return_storage_ptr__->pipeline).ptr.disposer = (Disposer *)0x0;
      (__return_storage_ptr__->pipeline).ptr.ptr = (PipelineHook *)0x0;
      (__return_storage_ptr__->resultExports).disposer = (ArrayDisposer *)0x0;
    }
    else {
      kj::
      Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>_>
      ::release((Entry *)local_68,&(this->high).table,(Entry *)local_68._0_8_);
      RpcSystemBase::RpcConnectionState::Answer::Answer
                (__return_storage_ptr__,(Answer *)(local_68 + 8));
      pAVar4 = local_28;
      puVar3 = puStack_30;
      if (puStack_30 != (uint *)0x0) {
        puStack_30 = (uint *)0x0;
        local_28 = (ArrayDisposer *)0x0;
        (**local_20->_vptr_ArrayDisposer)(local_20,puVar3,4,pAVar4,pAVar4,0);
      }
      kj::
      OneOf<kj::Promise<void>,_capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,_kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_>
      ::destroy((OneOf<kj::Promise<void>,_capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,_kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_>
                 *)auStack_50);
      uVar1 = local_68._16_8_;
      if ((PipelineHook *)local_68._16_8_ != (PipelineHook *)0x0) {
        local_68._16_8_ = (PipelineHook *)0x0;
        (***(_func_int ***)local_68._8_8_)
                  (local_68._8_8_,(*(_func_int ***)uVar1)[-2] + (long)(_func_int ***)uVar1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T erase(Id id) {
    // Remove an entry from the table and return it.  We return it so that the caller can be
    // careful to release it (possibly invoking arbitrary destructors) at a time that makes sense.
    if (id < kj::size(low)) {
      T toRelease = kj::mv(low[id]);
      low[id] = T();
      presenceBits &= ~(1 << id);
      return toRelease;
    } else {
      KJ_IF_SOME(entry, high.findEntry(id)) {
        return high.release(entry).value;
      } else {
        return {};
      }
    }